

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_one_block(working_state *state,JCOEFPTR block,int last_dc_val,c_derived_tbl *dctbl,
                        c_derived_tbl *actbl)

{
  jpeg_destination_mgr *pjVar1;
  byte bVar2;
  int iVar3;
  boolean bVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  byte bVar11;
  byte bVar12;
  byte *pbVar10;
  byte bVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  JOCTET *__dest;
  long lVar22;
  uint uVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  bit_buf_type bVar27;
  ulong uVar28;
  byte *pbVar29;
  byte bVar30;
  bool bVar31;
  bool bVar32;
  JOCTET _buffer [512];
  byte local_238 [520];
  
  iVar8 = (state->cur).free_bits;
  uVar16 = state->free_in_buffer;
  if (uVar16 < 0x200) {
    pbVar15 = local_238;
  }
  else {
    pbVar15 = state->next_output_byte;
  }
  bVar27 = (state->cur).put_buffer.c;
  iVar7 = *block - last_dc_val;
  iVar3 = -iVar7;
  if (0 < iVar7) {
    iVar3 = iVar7;
  }
  bVar17 = ""[iVar3];
  uVar23 = dctbl->ehufco[bVar17] << (bVar17 & 0x1f) |
           ~(uint)(-1L << (bVar17 & 0x3f)) & (iVar7 >> 0x1f) + iVar7;
  iVar7 = (int)dctbl->ehufsi[bVar17] + (uint)bVar17;
  iVar3 = iVar8 - iVar7;
  uVar28 = (ulong)(int)uVar23;
  if (iVar3 < 0) {
    bVar17 = -(char)iVar3 & 0x1f;
    uVar21 = (long)((int)uVar23 >> bVar17) | bVar27 << ((byte)iVar8 & 0x3f);
    bVar2 = (byte)(uVar21 >> 0x38);
    *pbVar15 = bVar2;
    bVar6 = (byte)uVar21;
    bVar11 = (byte)(uVar21 >> 8);
    bVar12 = (byte)(uVar21 >> 0x18);
    bVar20 = (byte)(uVar21 >> 0x20);
    bVar19 = (byte)(uVar21 >> 0x28);
    bVar18 = (byte)(uVar21 >> 0x30);
    bVar13 = (byte)(uVar21 >> 0x10);
    if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
      pbVar15[1] = bVar18;
      pbVar15[2] = bVar19;
      pbVar15[3] = bVar20;
      pbVar15[4] = bVar12;
      pbVar15[5] = bVar13;
      pbVar15[6] = bVar11;
      pbVar15[7] = bVar6;
      pbVar15 = pbVar15 + 8;
    }
    else {
      bVar17 = (byte)(0 >> bVar17);
      pbVar15[1] = bVar17;
      uVar26 = (ulong)(uVar21 >> 0x38 == 0xff);
      pbVar29 = pbVar15 + 1;
      if (bVar2 == 0xff) {
        pbVar29 = pbVar15 + 2;
      }
      pbVar15[uVar26 + 1] = bVar18;
      pbVar15[uVar26 + 2] = bVar17;
      uVar26 = ~uVar21;
      bVar31 = (uVar26 & 0xff000000000000) == 0;
      pbVar29[(ulong)bVar31 + 1] = bVar19;
      pbVar29[(ulong)bVar31 + 2] = bVar17;
      pbVar15 = pbVar29 + (ulong)bVar31 + 3;
      pbVar10 = pbVar29 + (ulong)bVar31 + 4;
      if ((uVar26 & 0xff0000000000) != 0) {
        pbVar10 = pbVar15;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
      }
      *pbVar15 = bVar20;
      *pbVar10 = bVar17;
      bVar31 = (uVar26 & 0xff00000000) == 0;
      pbVar15[(ulong)bVar31 + 1] = bVar12;
      uVar23 = (uint)uVar21 & 0xff000000;
      pbVar29 = pbVar15 + (ulong)bVar31 + 2;
      if (uVar23 == 0xff000000) {
        pbVar29 = pbVar15 + (ulong)bVar31 + 3;
      }
      pbVar15[(ulong)bVar31 + 2] = bVar17;
      *pbVar29 = bVar13;
      pbVar10 = pbVar15 + (ulong)bVar31 + 4;
      if (uVar23 != 0xff000000) {
        pbVar10 = pbVar15 + (ulong)bVar31 + 3;
      }
      *pbVar10 = bVar17;
      uVar23 = ~(uint)uVar21;
      bVar31 = (uVar23 & 0xff0000) == 0;
      pbVar29[(ulong)bVar31 + 1] = bVar11;
      pbVar29[(ulong)bVar31 + 2] = bVar17;
      bVar32 = (uVar23 & 0xff00) == 0;
      pbVar15 = pbVar29 + (ulong)bVar31 + 2;
      if (bVar32) {
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
      }
      *pbVar15 = bVar6;
      pbVar10 = pbVar29 + (ulong)bVar31 + 4;
      if (!bVar32) {
        pbVar10 = pbVar29 + (ulong)bVar31 + 3;
      }
      *pbVar10 = bVar17;
      pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
    }
    iVar3 = iVar3 + 0x40;
  }
  else {
    uVar28 = uVar28 | bVar27 << ((byte)iVar7 & 0x3f);
  }
  uVar23 = (uint)block[1];
  if (block[1] == 0) {
    lVar22 = 0x10;
  }
  else {
    uVar9 = -uVar23;
    if (0 < (int)uVar23) {
      uVar9 = uVar23;
    }
    bVar17 = ""[uVar9];
    uVar23 = actbl->ehufco[bVar17] << (bVar17 & 0x1f) |
             ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar23 >> 0x1f) + uVar23;
    iVar8 = (int)actbl->ehufsi[bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar23;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    lVar22 = 0;
    uVar28 = uVar21;
  }
  uVar23 = (uint)block[8];
  if (block[8] == 0) {
    uVar23 = (int)lVar22 + 0x10;
  }
  else {
    uVar9 = -uVar23;
    if (0 < (int)uVar23) {
      uVar9 = uVar23;
    }
    bVar17 = ""[uVar9];
    uVar23 = actbl->ehufco[lVar22 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar23 >> 0x1f) + uVar23;
    iVar8 = (int)actbl->ehufsi[lVar22 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar23;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar19;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x10];
  if (block[0x10] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[9];
  if (block[9] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[2];
  if (block[2] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[3];
  if (block[3] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[10];
  if (block[10] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x11];
  if (block[0x11] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar19;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x18];
  if (block[0x18] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x20];
  if (block[0x20] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x19];
  if (block[0x19] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x12];
  if (block[0x12] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0xb];
  if (block[0xb] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[4];
  if (block[4] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar20 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar20;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar19;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar20;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[5];
  if (block[5] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0xc];
  if (block[0xc] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ~(uint)(-1L << (bVar17 & 0x3f)) & ((int)uVar9 >> 0x1f) + uVar9;
    iVar8 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar7 = iVar3 - iVar8;
    uVar21 = (ulong)(int)uVar9;
    if (iVar7 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar7 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar20 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar20;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar12 = (byte)(uVar28 >> 0x18);
      bVar19 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar19;
        pbVar15[4] = bVar12;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar20 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar19;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar12;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar7 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar8 & 0x3f);
      iVar3 = iVar7;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x13];
  if (block[0x13] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    iVar8 = iVar3;
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar23 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar23 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar23 >> 0x10);
        bVar6 = (byte)(uVar23 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar14 = (uVar23 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar14 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar14 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar23 = ~(uVar23 | (uint)uVar28);
          bVar31 = (uVar23 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar23 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        uVar28 = (ulong)actbl->ehufco[0xf0];
        uVar23 = 0;
        iVar8 = iVar8 + 0x40;
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        uVar23 = 0;
      }
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x1a];
  if (block[0x1a] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x21];
  if (block[0x21] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar18 = (byte)(uVar28 >> 0x28);
        bVar19 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar19;
          pbVar15[2] = bVar18;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar19;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x28];
  if (block[0x28] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar20 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar20;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x30];
  if (block[0x30] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar18 = (byte)(uVar28 >> 0x28);
        bVar19 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar19;
          pbVar15[2] = bVar18;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar19;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x29];
  if (block[0x29] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar18 = (byte)(uVar28 >> 0x28);
        bVar19 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar19;
          pbVar15[2] = bVar18;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar19;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar20 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar20;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x22];
  if (block[0x22] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x1b];
  if (block[0x1b] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar18 = (byte)(uVar28 >> 0x28);
        bVar19 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar19;
          pbVar15[2] = bVar18;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar19;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0x14];
  if (block[0x14] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar18 = (byte)(uVar28 >> 0x28);
        bVar19 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar19;
          pbVar15[2] = bVar18;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar19;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar20 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar20;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0xd];
  if (block[0xd] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar2 = (byte)(uVar28 >> 0x28);
      bVar20 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar20;
        pbVar15[2] = bVar2;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar20;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[6];
  if (block[6] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar17 = (byte)uVar28;
      bVar6 = (byte)(uVar28 >> 8);
      bVar11 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar20 = (byte)(uVar28 >> 0x28);
      bVar2 = (byte)(uVar28 >> 0x30);
      bVar19 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar2;
        pbVar15[2] = bVar20;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar11;
        pbVar15[5] = bVar19;
        pbVar15[6] = bVar6;
        pbVar15[7] = bVar17;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar26 + 1] = bVar2;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar20;
        pbVar29[(ulong)bVar31 + 2] = 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if ((uVar26 & 0xff0000000000) != 0) {
          pbVar10 = pbVar15;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        }
        *pbVar15 = bVar12;
        *pbVar10 = 0;
        bVar31 = (uVar26 & 0xff00000000) == 0;
        pbVar15[(ulong)bVar31 + 1] = bVar11;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        pbVar15[(ulong)bVar31 + 2] = 0;
        *pbVar29 = bVar19;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar6;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar17;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar17 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[7];
  if (block[7] == 0) {
    uVar23 = uVar23 + 0x10;
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar2 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar2;
        bVar13 = (byte)uVar21;
        bVar30 = (byte)(uVar21 >> 8);
        bVar24 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar18 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar18;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar24;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar30;
          pbVar15[7] = bVar13;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar2 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar18;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if ((uVar21 & 0xff0000000000) != 0) {
            pbVar10 = pbVar15;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          }
          *pbVar15 = bVar24;
          *pbVar10 = 0;
          bVar31 = (uVar21 & 0xff00000000) == 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          pbVar15[(ulong)bVar31 + 2] = 0;
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar30;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar21 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar26 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar28;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar26 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar26 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar21 = uVar21 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar23 = 0;
    uVar28 = uVar21;
  }
  uVar9 = (uint)block[0xe];
  if (block[0xe] == 0) {
    uVar21 = (ulong)(uVar23 + 0x10);
  }
  else {
    uVar14 = -uVar9;
    if (0 < (int)uVar9) {
      uVar14 = uVar9;
    }
    bVar17 = ""[uVar14];
    if (0xff < uVar23) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar30 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar30;
        bVar2 = (byte)uVar21;
        bVar18 = (byte)(uVar21 >> 8);
        bVar13 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar24 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar24;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar13;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar18;
          pbVar15[7] = bVar2;
          pbVar15 = pbVar15 + 8;
        }
        else {
          pbVar15[1] = 0;
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar30 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[uVar21 + 1] = bVar24;
          uVar26 = ~uVar28;
          bVar31 = (uVar26 & 0xff000000000000) == 0;
          pbVar15[uVar21 + 2] = 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar26 & 0xff0000000000) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          bVar31 = (uVar26 & 0xff00000000) == 0;
          *pbVar10 = 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          pbVar15[(ulong)bVar31 + 2] = 0;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar2;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar2 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar28 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar23 = uVar23 - 0x100;
    }
    uVar9 = actbl->ehufco[(ulong)uVar23 + (ulong)bVar17] << (bVar17 & 0x1f) |
            ((int)uVar9 >> 0x1f) + uVar9 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar23 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar26 = (ulong)(int)uVar9;
    if (iVar8 < 0) {
      uVar28 = (long)((int)uVar9 >> (-(char)iVar8 & 0x1fU)) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar23 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar28;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar26 = uVar26 | uVar28 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar21 = 0;
    uVar28 = uVar26;
  }
  uVar23 = (uint)block[0x15];
  uVar9 = (uint)uVar21;
  if (block[0x15] == 0) {
    uVar21 = (ulong)(uVar9 + 0x10);
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar26 = uVar28;
    if (0xff < uVar9) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar30 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar30;
        bVar2 = (byte)uVar21;
        bVar18 = (byte)(uVar21 >> 8);
        bVar13 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar24 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar24;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar13;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar18;
          pbVar15[7] = bVar2;
          pbVar15 = pbVar15 + 8;
        }
        else {
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar30 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[1] = 0;
          pbVar15[uVar21 + 1] = bVar24;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar21 & 0xff0000000000) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          bVar31 = (uVar21 & 0xff00000000) == 0;
          *pbVar10 = 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          pbVar15[(ulong)bVar31 + 2] = 0;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar2;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar2 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar21 = (ulong)(uVar9 - 0x100);
    }
    uVar23 = actbl->ehufco[uVar21 + bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[uVar21 + bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar28 = (ulong)(int)uVar23;
    if (iVar8 < 0) {
      uVar21 = (long)((int)uVar23 >> (-(char)iVar8 & 0x1fU)) | uVar26 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar21 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar21;
      bVar11 = (byte)(uVar21 >> 8);
      bVar20 = (byte)(uVar21 >> 0x18);
      bVar12 = (byte)(uVar21 >> 0x20);
      bVar18 = (byte)(uVar21 >> 0x28);
      bVar19 = (byte)(uVar21 >> 0x30);
      bVar17 = (byte)(uVar21 >> 0x10);
      if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar26 = (ulong)(uVar21 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar26 + 1] = bVar19;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar21;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar26 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar26 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar23 = (uint)uVar21 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar21;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar21 = 0;
  }
  uVar23 = (uint)block[0x1c];
  uVar9 = (uint)uVar21;
  if (block[0x1c] == 0) {
    uVar21 = (ulong)(uVar9 + 0x10);
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar26 = uVar28;
    if (0xff < uVar9) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar30 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar30;
        bVar2 = (byte)uVar21;
        bVar18 = (byte)(uVar21 >> 8);
        bVar13 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar24 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar24;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar13;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar18;
          pbVar15[7] = bVar2;
          pbVar15 = pbVar15 + 8;
        }
        else {
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar30 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[1] = 0;
          pbVar15[uVar21 + 1] = bVar24;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar21 & 0xff0000000000) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          bVar31 = (uVar21 & 0xff00000000) == 0;
          *pbVar10 = 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          pbVar15[(ulong)bVar31 + 2] = 0;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar2;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar2 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar21 = (ulong)(uVar9 - 0x100);
    }
    uVar23 = actbl->ehufco[uVar21 + bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[uVar21 + bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar28 = (ulong)(int)uVar23;
    if (iVar8 < 0) {
      uVar21 = (long)((int)uVar23 >> (-(char)iVar8 & 0x1fU)) | uVar26 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar21 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar21;
      bVar11 = (byte)(uVar21 >> 8);
      bVar20 = (byte)(uVar21 >> 0x18);
      bVar12 = (byte)(uVar21 >> 0x20);
      bVar19 = (byte)(uVar21 >> 0x28);
      bVar18 = (byte)(uVar21 >> 0x30);
      bVar17 = (byte)(uVar21 >> 0x10);
      if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar26 = (ulong)(uVar21 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar26 + 1] = bVar18;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar21;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar26 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar26 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar23 = (uint)uVar21 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar21;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar21 = 0;
  }
  uVar23 = (uint)block[0x23];
  uVar9 = (uint)uVar21;
  if (block[0x23] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar26 = uVar28;
    if (0xff < uVar9) {
      iVar8 = iVar3 - actbl->ehufsi[0xf0];
      if (iVar8 < 0) {
        uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
        uVar14 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
        uVar21 = uVar14 | uVar28;
        bVar30 = (byte)(uVar28 >> 0x38);
        *pbVar15 = bVar30;
        bVar2 = (byte)uVar21;
        bVar18 = (byte)(uVar21 >> 8);
        bVar13 = (byte)(uVar28 >> 0x20);
        bVar19 = (byte)(uVar28 >> 0x28);
        bVar24 = (byte)(uVar28 >> 0x30);
        bVar20 = (byte)(uVar28 >> 0x10);
        bVar11 = (byte)(uVar28 >> 0x18);
        bVar12 = (byte)(uVar14 >> 0x10);
        bVar6 = (byte)(uVar14 >> 0x18);
        if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
          pbVar15[1] = bVar24;
          pbVar15[2] = bVar19;
          pbVar15[3] = bVar13;
          pbVar15[4] = bVar6 | bVar11;
          pbVar15[5] = bVar12 | bVar20;
          pbVar15[6] = bVar18;
          pbVar15[7] = bVar2;
          pbVar15 = pbVar15 + 8;
        }
        else {
          uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
          pbVar29 = pbVar15 + 1;
          if (bVar30 == 0xff) {
            pbVar29 = pbVar15 + 2;
          }
          pbVar15[1] = 0;
          pbVar15[uVar21 + 1] = bVar24;
          pbVar15[uVar21 + 2] = 0;
          uVar21 = ~uVar28;
          bVar31 = (uVar21 & 0xff000000000000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar19;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar21 & 0xff0000000000) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar13;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          bVar31 = (uVar21 & 0xff00000000) == 0;
          *pbVar10 = 0;
          pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
          pbVar15[(ulong)bVar31 + 2] = 0;
          uVar25 = (uVar14 | (uint)uVar28) & 0xff000000;
          pbVar29 = pbVar15 + (ulong)bVar31 + 2;
          if (uVar25 == 0xff000000) {
            pbVar29 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar29 = bVar12 | bVar20;
          pbVar10 = pbVar15 + (ulong)bVar31 + 4;
          if (uVar25 != 0xff000000) {
            pbVar10 = pbVar15 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          uVar14 = ~(uVar14 | (uint)uVar28);
          bVar31 = (uVar14 & 0xff0000) == 0;
          pbVar29[(ulong)bVar31 + 1] = bVar18;
          pbVar29[(ulong)bVar31 + 2] = 0;
          bVar32 = (uVar14 & 0xff00) == 0;
          pbVar15 = pbVar29 + (ulong)bVar31 + 2;
          if (bVar32) {
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar15 = bVar2;
          pbVar10 = pbVar29 + (ulong)bVar31 + 4;
          if (!bVar32) {
            pbVar10 = pbVar29 + (ulong)bVar31 + 3;
          }
          *pbVar10 = 0;
          pbVar15 = pbVar15 + (ulong)(bVar2 == 0xff) + 1;
        }
        iVar3 = iVar8 + 0x40;
        uVar26 = (ulong)actbl->ehufco[0xf0];
      }
      else {
        uVar26 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
        iVar3 = iVar8;
      }
      uVar21 = (ulong)(uVar9 - 0x100);
    }
    uVar23 = actbl->ehufco[uVar21 + bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[uVar21 + bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    uVar28 = (ulong)(int)uVar23;
    if (iVar8 < 0) {
      uVar21 = (long)((int)uVar23 >> (-(char)iVar8 & 0x1fU)) | uVar26 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar21 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar21;
      bVar11 = (byte)(uVar21 >> 8);
      bVar20 = (byte)(uVar21 >> 0x18);
      bVar12 = (byte)(uVar21 >> 0x20);
      bVar18 = (byte)(uVar21 >> 0x28);
      bVar19 = (byte)(uVar21 >> 0x30);
      bVar17 = (byte)(uVar21 >> 0x10);
      if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar26 = (ulong)(uVar21 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar26 + 1] = bVar19;
        pbVar15[uVar26 + 2] = 0;
        uVar26 = ~uVar21;
        bVar31 = (uVar26 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar26 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar26 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar23 = (uint)uVar21 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar23 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar23 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uint)uVar21;
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar8 + 0x40;
    }
    else {
      uVar28 = uVar28 | uVar26 << ((byte)iVar7 & 0x3f);
      iVar3 = iVar8;
    }
    uVar9 = 0;
  }
  uVar23 = (uint)block[0x2a];
  if (block[0x2a] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x31];
  if (block[0x31] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x38];
  if (block[0x38] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x39];
  if (block[0x39] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x32];
  if (block[0x32] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x2b];
  if (block[0x2b] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x24];
  if (block[0x24] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x1d];
  if (block[0x1d] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x16];
  if (block[0x16] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0xf];
  if (block[0xf] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x17];
  if (block[0x17] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x1e];
  if (block[0x1e] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x25];
  if (block[0x25] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x2c];
  if (block[0x2c] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x33];
  if (block[0x33] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3a];
  if (block[0x3a] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3b];
  if (block[0x3b] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x34];
  if (block[0x34] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x2d];
  if (block[0x2d] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x26];
  if (block[0x26] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x1f];
  if (block[0x1f] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x27];
  if (block[0x27] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x2e];
  if (block[0x2e] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x35];
  if (block[0x35] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3c];
  if (block[0x3c] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3d];
  if (block[0x3d] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x36];
  if (block[0x36] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x2f];
  if (block[0x2f] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x37];
  if (block[0x37] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar18 = (byte)(uVar28 >> 0x28);
      bVar19 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar19;
        pbVar15[2] = bVar18;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar19;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar18;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3e];
  if (block[0x3e] == 0) {
    uVar9 = uVar9 + 0x10;
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    iVar8 = iVar3;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar19 = (byte)(uVar28 >> 0x28);
          bVar18 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar18;
            pbVar15[2] = bVar19;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar18;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar19;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
        iVar8 = iVar3;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar3 = iVar8 - iVar7;
    if (iVar3 < 0) {
      uVar28 = (long)((int)uVar23 >> (-(char)iVar3 & 0x1fU)) | uVar28 << ((byte)iVar8 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar6 = (byte)uVar28;
      bVar11 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar12 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar17 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar12;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar17;
        pbVar15[6] = bVar11;
        pbVar15[7] = bVar6;
        pbVar15 = pbVar15 + 8;
      }
      else {
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[1] = 0;
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar12;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar17;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar11;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar6;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar6 == 0xff) + 1;
      }
      iVar3 = iVar3 + 0x40;
      uVar9 = 0;
      uVar28 = (long)(int)uVar23;
    }
    else {
      uVar9 = 0;
      uVar28 = (long)(int)uVar23 | uVar28 << ((byte)iVar7 & 0x3f);
    }
  }
  uVar23 = (uint)block[0x3f];
  if (block[0x3f] == 0) {
    iVar8 = iVar3 - actbl->ehufsi[0];
    uVar21 = (ulong)actbl->ehufco[0];
    if (iVar8 < 0) {
      uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
      uVar23 = actbl->ehufco[0] >> (-(char)iVar8 & 0x1fU);
      uVar21 = uVar23 | uVar28;
      bVar18 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar18;
      bVar20 = (byte)uVar21;
      bVar2 = (byte)(uVar21 >> 8);
      bVar30 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar13 = (byte)(uVar28 >> 0x30);
      bVar12 = (byte)(uVar28 >> 0x10);
      bVar6 = (byte)(uVar28 >> 0x18);
      bVar11 = (byte)(uVar23 >> 0x10);
      bVar17 = (byte)(uVar23 >> 0x18);
      if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
        pbVar15[1] = bVar13;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar30;
        pbVar15[4] = bVar17 | bVar6;
        pbVar15[5] = bVar11 | bVar12;
        pbVar15[6] = bVar2;
        pbVar15[7] = bVar20;
        pbVar15 = pbVar15 + 8;
      }
      else {
        pbVar15[1] = 0;
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar18 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar21 + 1] = bVar13;
        pbVar15[uVar21 + 2] = 0;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar30;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = 0;
        pbVar15[(ulong)bVar31 + 1] = bVar17 | bVar6;
        pbVar15[(ulong)bVar31 + 2] = 0;
        uVar9 = (uVar23 | (uint)uVar28) & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar11 | bVar12;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        uVar23 = ~(uVar23 | (uint)uVar28);
        bVar31 = (uVar23 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar2;
        pbVar29[(ulong)bVar31 + 2] = 0;
        bVar32 = (uVar23 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar20;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = 0;
        pbVar15 = pbVar15 + (ulong)(bVar20 == 0xff) + 1;
      }
      iVar8 = iVar8 + 0x40;
      bVar27 = (bit_buf_type)actbl->ehufco[0];
      goto LAB_0013d42e;
    }
    uVar28 = uVar28 << (actbl->ehufsi[0] & 0x3fU);
  }
  else {
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    bVar17 = ""[uVar14];
    uVar14 = uVar9;
    if (0xff < uVar9) {
      do {
        iVar8 = iVar3 - actbl->ehufsi[0xf0];
        if (iVar8 < 0) {
          uVar28 = uVar28 << ((byte)iVar3 & 0x3f);
          uVar9 = actbl->ehufco[0xf0] >> (-(char)iVar8 & 0x1fU);
          uVar21 = uVar9 | uVar28;
          bVar2 = (byte)(uVar28 >> 0x38);
          *pbVar15 = bVar2;
          bVar13 = (byte)uVar21;
          bVar30 = (byte)(uVar21 >> 8);
          bVar24 = (byte)(uVar28 >> 0x20);
          bVar18 = (byte)(uVar28 >> 0x28);
          bVar19 = (byte)(uVar28 >> 0x30);
          bVar20 = (byte)(uVar28 >> 0x10);
          bVar11 = (byte)(uVar28 >> 0x18);
          bVar12 = (byte)(uVar9 >> 0x10);
          bVar6 = (byte)(uVar9 >> 0x18);
          if ((uVar21 & 0x8080808080808080 & 0xfefefefefefefefe - uVar21) == 0) {
            pbVar15[1] = bVar19;
            pbVar15[2] = bVar18;
            pbVar15[3] = bVar24;
            pbVar15[4] = bVar6 | bVar11;
            pbVar15[5] = bVar12 | bVar20;
            pbVar15[6] = bVar30;
            pbVar15[7] = bVar13;
            pbVar15 = pbVar15 + 8;
          }
          else {
            pbVar15[1] = 0;
            uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
            pbVar29 = pbVar15 + 1;
            if (bVar2 == 0xff) {
              pbVar29 = pbVar15 + 2;
            }
            pbVar15[uVar21 + 1] = bVar19;
            pbVar15[uVar21 + 2] = 0;
            uVar21 = ~uVar28;
            bVar31 = (uVar21 & 0xff000000000000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar18;
            pbVar29[(ulong)bVar31 + 2] = 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if ((uVar21 & 0xff0000000000) != 0) {
              pbVar10 = pbVar15;
              pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            }
            *pbVar15 = bVar24;
            *pbVar10 = 0;
            bVar31 = (uVar21 & 0xff00000000) == 0;
            pbVar15[(ulong)bVar31 + 1] = bVar6 | bVar11;
            uVar25 = (uVar9 | (uint)uVar28) & 0xff000000;
            pbVar29 = pbVar15 + (ulong)bVar31 + 2;
            if (uVar25 == 0xff000000) {
              pbVar29 = pbVar15 + (ulong)bVar31 + 3;
            }
            pbVar15[(ulong)bVar31 + 2] = 0;
            *pbVar29 = bVar12 | bVar20;
            pbVar10 = pbVar15 + (ulong)bVar31 + 4;
            if (uVar25 != 0xff000000) {
              pbVar10 = pbVar15 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            uVar9 = ~(uVar9 | (uint)uVar28);
            bVar31 = (uVar9 & 0xff0000) == 0;
            pbVar29[(ulong)bVar31 + 1] = bVar30;
            pbVar29[(ulong)bVar31 + 2] = 0;
            bVar32 = (uVar9 & 0xff00) == 0;
            pbVar15 = pbVar29 + (ulong)bVar31 + 2;
            if (bVar32) {
              pbVar15 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar15 = bVar13;
            pbVar10 = pbVar29 + (ulong)bVar31 + 4;
            if (!bVar32) {
              pbVar10 = pbVar29 + (ulong)bVar31 + 3;
            }
            *pbVar10 = 0;
            pbVar15 = pbVar15 + (ulong)(bVar13 == 0xff) + 1;
          }
          iVar3 = iVar8 + 0x40;
          uVar28 = (ulong)actbl->ehufco[0xf0];
        }
        else {
          uVar28 = uVar28 << (actbl->ehufsi[0xf0] & 0x3fU) | (ulong)actbl->ehufco[0xf0];
          iVar3 = iVar8;
        }
        uVar9 = uVar14 - 0x100;
        bVar31 = 0x1ff < uVar14;
        uVar14 = uVar9;
      } while (bVar31);
    }
    uVar23 = actbl->ehufco[(ulong)uVar9 + (ulong)bVar17] << (bVar17 & 0x1f) |
             ((int)uVar23 >> 0x1f) + uVar23 & ~(uint)(-1L << (bVar17 & 0x3f));
    iVar7 = (int)actbl->ehufsi[(ulong)uVar9 + (ulong)bVar17] + (uint)bVar17;
    iVar8 = iVar3 - iVar7;
    if (iVar8 < 0) {
      bVar17 = -(char)iVar8 & 0x1f;
      uVar28 = (long)((int)uVar23 >> bVar17) | uVar28 << ((byte)iVar3 & 0x3f);
      bVar2 = (byte)(uVar28 >> 0x38);
      *pbVar15 = bVar2;
      bVar11 = (byte)uVar28;
      bVar12 = (byte)(uVar28 >> 8);
      bVar20 = (byte)(uVar28 >> 0x18);
      bVar13 = (byte)(uVar28 >> 0x20);
      bVar19 = (byte)(uVar28 >> 0x28);
      bVar18 = (byte)(uVar28 >> 0x30);
      bVar6 = (byte)(uVar28 >> 0x10);
      if ((uVar28 & 0x8080808080808080 & 0xfefefefefefefefe - uVar28) == 0) {
        pbVar15[1] = bVar18;
        pbVar15[2] = bVar19;
        pbVar15[3] = bVar13;
        pbVar15[4] = bVar20;
        pbVar15[5] = bVar6;
        pbVar15[6] = bVar12;
        pbVar15[7] = bVar11;
        pbVar15 = pbVar15 + 8;
      }
      else {
        bVar17 = (byte)(0 >> bVar17);
        pbVar15[1] = bVar17;
        uVar21 = (ulong)(uVar28 >> 0x38 == 0xff);
        pbVar29 = pbVar15 + 1;
        if (bVar2 == 0xff) {
          pbVar29 = pbVar15 + 2;
        }
        pbVar15[uVar21 + 1] = bVar18;
        pbVar15[uVar21 + 2] = bVar17;
        uVar21 = ~uVar28;
        bVar31 = (uVar21 & 0xff000000000000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar19;
        pbVar29[(ulong)bVar31 + 2] = bVar17;
        bVar32 = (uVar21 & 0xff0000000000) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar13;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        bVar31 = (uVar21 & 0xff00000000) == 0;
        *pbVar10 = bVar17;
        pbVar15[(ulong)bVar31 + 1] = bVar20;
        pbVar15[(ulong)bVar31 + 2] = bVar17;
        uVar9 = (uint)uVar28 & 0xff000000;
        pbVar29 = pbVar15 + (ulong)bVar31 + 2;
        if (uVar9 == 0xff000000) {
          pbVar29 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar29 = bVar6;
        pbVar10 = pbVar15 + (ulong)bVar31 + 4;
        if (uVar9 != 0xff000000) {
          pbVar10 = pbVar15 + (ulong)bVar31 + 3;
        }
        *pbVar10 = bVar17;
        uVar9 = ~(uint)uVar28;
        bVar31 = (uVar9 & 0xff0000) == 0;
        pbVar29[(ulong)bVar31 + 1] = bVar12;
        pbVar29[(ulong)bVar31 + 2] = bVar17;
        bVar32 = (uVar9 & 0xff00) == 0;
        pbVar15 = pbVar29 + (ulong)bVar31 + 2;
        if (bVar32) {
          pbVar15 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar15 = bVar11;
        pbVar10 = pbVar29 + (ulong)bVar31 + 4;
        if (!bVar32) {
          pbVar10 = pbVar29 + (ulong)bVar31 + 3;
        }
        *pbVar10 = bVar17;
        pbVar15 = pbVar15 + (ulong)(bVar11 == 0xff) + 1;
      }
      iVar8 = iVar8 + 0x40;
      bVar27 = (bit_buf_type)(int)uVar23;
      goto LAB_0013d42e;
    }
    uVar21 = uVar28 << ((byte)iVar7 & 0x3f);
    uVar28 = (ulong)(int)uVar23;
  }
  bVar27 = uVar28 | uVar21;
LAB_0013d42e:
  (state->cur).put_buffer.c = bVar27;
  (state->cur).free_bits = iVar8;
  if (uVar16 < 0x200) {
    pbVar29 = local_238;
    uVar16 = (long)pbVar15 - (long)pbVar29;
    if (uVar16 != 0) {
      __dest = state->next_output_byte;
      sVar5 = state->free_in_buffer;
      do {
        uVar28 = sVar5;
        if (uVar16 < sVar5) {
          uVar28 = uVar16;
        }
        memcpy(__dest,pbVar29,uVar28);
        __dest = state->next_output_byte + uVar28;
        state->next_output_byte = __dest;
        sVar5 = state->free_in_buffer - uVar28;
        state->free_in_buffer = sVar5;
        if (sVar5 == 0) {
          pjVar1 = state->cinfo->dest;
          bVar4 = (*pjVar1->empty_output_buffer)(state->cinfo);
          if (bVar4 == 0) {
            return 0;
          }
          __dest = pjVar1->next_output_byte;
          state->next_output_byte = __dest;
          sVar5 = pjVar1->free_in_buffer;
          state->free_in_buffer = sVar5;
        }
        pbVar29 = pbVar29 + uVar28;
        uVar16 = uVar16 - uVar28;
      } while (uVar16 != 0);
    }
  }
  else {
    state->free_in_buffer =
         (size_t)(state->next_output_byte + (state->free_in_buffer - (long)pbVar15));
    state->next_output_byte = pbVar15;
  }
  return 1;
}

Assistant:

LOCAL(boolean)
encode_one_block(working_state *state, JCOEFPTR block, int last_dc_val,
                 c_derived_tbl *dctbl, c_derived_tbl *actbl)
{
  int temp, nbits, free_bits;
  bit_buf_type put_buffer;
  JOCTET _buffer[BUFSIZE], *buffer;
  int localbuf = 0;

  free_bits = state->cur.free_bits;
  put_buffer = state->cur.put_buffer.c;
  LOAD_BUFFER()

  /* Encode the DC coefficient difference per section F.1.2.1 */

  temp = block[0] - last_dc_val;

  /* This is a well-known technique for obtaining the absolute value without a
   * branch.  It is derived from an assembly language technique presented in
   * "How to Optimize for the Pentium Processors", Copyright (c) 1996, 1997 by
   * Agner Fog.  This code assumes we are on a two's complement machine.
   */
  nbits = temp >> (CHAR_BIT * sizeof(int) - 1);
  temp += nbits;
  nbits ^= temp;

  /* Find the number of bits needed for the magnitude of the coefficient */
  nbits = JPEG_NBITS(nbits);

  /* Emit the Huffman-coded symbol for the number of bits.
   * Emit that number of bits of the value, if positive,
   * or the complement of its magnitude, if negative.
   */
  PUT_CODE(dctbl->ehufco[nbits], dctbl->ehufsi[nbits])

  /* Encode the AC coefficients per section F.1.2.2 */

  {
    int r = 0;                  /* r = run length of zeros */

/* Manually unroll the k loop to eliminate the counter variable.  This
 * improves performance greatly on systems with a limited number of
 * registers (such as x86.)
 */
#define kloop(jpeg_natural_order_of_k) { \
  if ((temp = block[jpeg_natural_order_of_k]) == 0) { \
    r += 16; \
  } else { \
    /* Branch-less absolute value, bitwise complement, etc., same as above */ \
    nbits = temp >> (CHAR_BIT * sizeof(int) - 1); \
    temp += nbits; \
    nbits ^= temp; \
    nbits = JPEG_NBITS_NONZERO(nbits); \
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */ \
    while (r >= 16 * 16) { \
      r -= 16 * 16; \
      PUT_BITS(actbl->ehufco[0xf0], actbl->ehufsi[0xf0]) \
    } \
    /* Emit Huffman symbol for run length / number of bits */ \
    r += nbits; \
    PUT_CODE(actbl->ehufco[r], actbl->ehufsi[r]) \
    r = 0; \
  } \
}